

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUISetting.cpp
# Opt level: O0

void __thiscall GUISetting::acceptSettings(GUISetting *this)

{
  byte bVar1;
  int iVar2;
  mapped_type *pmVar3;
  QButtonGroup *pQVar4;
  bool bVar5;
  bool bVar6;
  key_type local_98;
  bool colorChanged;
  key_type kStack_94;
  bool numberImageChanged;
  key_type local_90 [4];
  key_type local_80;
  undefined1 local_79;
  QFlags<QMessageBox::StandardButton> local_78;
  anon_class_1_0_00000001 getChecked;
  QString local_68;
  QString local_50;
  byte local_31;
  key_type kStack_30;
  bool tileSizeChanged;
  undefined1 local_24 [8];
  OptionsData newOptions;
  GUISetting *this_local;
  
  newOptions._12_8_ = this;
  iVar2 = QAbstractSlider::value();
  kStack_30 = (key_type)iVar2;
  pmVar3 = std::
           map<unsigned_long,_TileSize,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TileSize>_>_>
           ::at(&Maps::sliderTileSize,&stack0xffffffffffffffd0);
  newOptions._4_4_ = *pmVar3;
  local_31 = newOptions._4_4_ != (this->currentOptions).tileSize;
  if (((bool)local_31) && (this->boardMode == GRAPHIC)) {
    QString::QString(&local_50,"");
    QString::QString(&local_68,
                     "\nSize of a tile can not be changed in graphic mode\t \nwhen an image has been loaded"
                    );
    QFlags<QMessageBox::StandardButton>::QFlags(&local_78,FirstButton);
    QMessageBox::information
              ((QWidget *)this,(QString *)&local_50,(QString *)&local_68,
               (QFlags_conflict *)(ulong)(uint)local_78.i,NoButton);
    QString::~QString(&local_68);
    QString::~QString(&local_50);
  }
  else {
    local_79 = 0;
    local_80 = SCALED;
    std::
    map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
    ::operator[](&this->mapGraphicMode,&local_80);
    bVar1 = QAbstractButton::isChecked();
    local_24._0_4_ = ZEXT14((bVar1 & 1) == 0);
    local_90[3] = 0;
    std::
    map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
    ::operator[](&this->mapImageToLoad,local_90 + 3);
    bVar1 = QAbstractButton::isChecked();
    local_24[4] = (bool)(bVar1 & 1);
    local_90[2] = 1;
    std::
    map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
    ::operator[](&this->mapImageToLoad,local_90 + 2);
    bVar1 = QAbstractButton::isChecked();
    local_24[5] = (bool)(bVar1 & 1);
    local_90[1] = 2;
    std::
    map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
    ::operator[](&this->mapImageToLoad,local_90 + 1);
    bVar1 = QAbstractButton::isChecked();
    local_24[6] = (bool)(bVar1 & 1);
    local_90[0] = SEVEN;
    std::
    map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
    ::operator[](&this->mapImageToLoad,local_90);
    bVar1 = QAbstractButton::isChecked();
    local_24[7] = (bool)(bVar1 & 1);
    kStack_94 = NO;
    std::
    map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>
    ::operator[](&this->mapNumberOnImage,&stack0xffffffffffffff6c);
    pQVar4 = (QButtonGroup *)QAbstractButton::group();
    newOptions.squareColor =
         acceptSettings()::$_0::operator()(&local_79,&this->mapNumberOnImage,pQVar4);
    local_98 = BLUE;
    std::
    map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>
    ::operator[](&this->mapTileColor,&local_98);
    pQVar4 = (QButtonGroup *)QAbstractButton::group();
    newOptions.graphicMode = acceptSettings()::$_0::operator()(&local_79,&this->mapTileColor,pQVar4)
    ;
    bVar5 = newOptions.squareColor != (this->currentOptions).numberColor;
    bVar6 = newOptions.graphicMode != (this->currentOptions).squareColor;
    Options::saveOptions((OptionsData *)local_24);
    if ((((local_31 & 1) != 0) && (this->boardMode == NUMERIC)) ||
       ((bVar5 && (this->boardMode == GRAPHIC)))) {
      Fifteen::redrawTiles(this->owner);
    }
    if ((bVar6) && (this->boardMode == NUMERIC)) {
      Fifteen::setColor(this->owner);
    }
    QWidget::close();
  }
  return;
}

Assistant:

void GUISetting::acceptSettings()
{
    OptionsData newOptions;

    newOptions.tileSize = Maps::sliderTileSize.at( slider->value() );
    bool tileSizeChanged = newOptions.tileSize != currentOptions.tileSize;
    if ( tileSizeChanged && boardMode == BoardMode::GRAPHIC )
    {
        QMessageBox::information( this, "",
                                  "\nSize of a tile can not be changed in graphic mode\t \nwhen an image has been loaded" );
        return;
    }

    const auto getChecked = [](const auto& mapRadio, const QButtonGroup* group)
    {
        QAbstractButton* checked = group->checkedButton();
        for ( const auto& [key, value] : mapRadio )
        {
            if ( &value == checked )
            {
                return key;
            }
        }
        return mapRadio.begin()->first;
    };

    newOptions.graphicMode = mapGraphicMode[GraphicMode::SCALED].isChecked() ? GraphicMode::SCALED : GraphicMode::CROPPED;
    newOptions.imageToLoad_4 = mapImageToLoad[BoardSize::FOUR].isChecked();
    newOptions.imageToLoad_5 = mapImageToLoad[BoardSize::FIVE].isChecked();
    newOptions.imageToLoad_6 = mapImageToLoad[BoardSize::SIX].isChecked();
    newOptions.imageToLoad_7 = mapImageToLoad[BoardSize::SEVEN].isChecked();
    newOptions.numberColor = getChecked( mapNumberOnImage, mapNumberOnImage[NumberColor::NO].group() );
    newOptions.squareColor = getChecked( mapTileColor, mapTileColor[TileColor::BLUE].group() );

    bool numberImageChanged = newOptions.numberColor != currentOptions.numberColor;
    bool colorChanged = newOptions.squareColor != currentOptions.squareColor;

    Options::saveOptions( newOptions );

    if (( tileSizeChanged && boardMode == BoardMode::NUMERIC  ) ||
        ( numberImageChanged && boardMode == BoardMode::GRAPHIC ))
    {
        owner.redrawTiles();
    }
    if ( colorChanged && boardMode == BoardMode::NUMERIC )
    {
        owner.setColor();
    }
    close();
}